

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

void replace_helper(QString *str,QSpan<unsigned_long,_18446744073709551615UL> indices,qsizetype blen
                   ,QStringView after)

{
  Data *pDVar1;
  QChar *pQVar2;
  bool bVar3;
  char16_t *pcVar4;
  QChar *pQVar5;
  long lVar6;
  long extraout_RDX;
  long lVar7;
  size_t sVar8;
  QChar *first;
  long lVar9;
  char16_t *__src;
  char16_t *__dest;
  long lVar10;
  long in_FS_OFFSET;
  QStringView after_00;
  longlong __n2;
  undefined1 local_258 [16];
  undefined1 *local_248;
  qsizetype local_50;
  storage_type_conflict *local_48;
  long local_38;
  
  lVar9 = after.m_size;
  first = (QChar *)after.m_data;
  lVar6 = indices.super_QSpanBase<unsigned_long,_18446744073709551615UL>.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = (str->d).d;
  lVar10 = (str->d).size;
  lVar7 = lVar6;
  if ((pDVar1 == (Data *)0x0) ||
     (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_0011bc5f:
    __src = (str->d).ptr;
    local_248 = &DAT_aaaaaaaaaaaaaaaa;
    local_258._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_258._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QString::QString((QString *)local_258,(lVar9 - blen) * lVar6 + lVar10,(Initialization)lVar7);
    __dest = (char16_t *)local_258._8_8_;
    for (lVar10 = 0; lVar6 << 3 != lVar10; lVar10 = lVar10 + 8) {
      lVar7 = *(long *)((long)indices.super_QSpanBase<unsigned_long,_18446744073709551615UL>.m_data
                       + lVar10);
      pcVar4 = (str->d).ptr;
      sVar8 = (long)pcVar4 + (lVar7 * 2 - (long)__src);
      if (sVar8 != 0) {
        memmove(__dest,__src,sVar8);
      }
      __dest = (char16_t *)((long)__dest + sVar8);
      if (0 < lVar9) {
        memmove(__dest,first,lVar9 * 2);
        __dest = __dest + lVar9;
      }
      __src = pcVar4 + lVar7 + blen;
    }
    pcVar4 = (str->d).ptr;
    lVar10 = (str->d).size;
    sVar8 = (long)pcVar4 + (lVar10 * 2 - (long)__src);
    if (sVar8 != 0) {
      memmove(__dest,__src,sVar8);
      pcVar4 = (str->d).ptr;
      lVar10 = (str->d).size;
    }
    pDVar1 = (str->d).d;
    (str->d).d = (Data *)local_258._0_8_;
    (str->d).ptr = (char16_t *)local_258._8_8_;
    (str->d).size = (qsizetype)local_248;
    local_258._0_8_ = pDVar1;
    local_258._8_8_ = pcVar4;
    local_248 = (undefined1 *)lVar10;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_258);
  }
  else {
    bVar3 = needsReallocate(str,lVar10 + (lVar9 - blen) * lVar6);
    lVar10 = (str->d).size;
    lVar7 = extraout_RDX;
    if (bVar3) goto LAB_0011bc5f;
    pQVar2 = (QChar *)(str->d).ptr;
    pQVar5 = (QChar *)L"";
    if (pQVar2 != (QChar *)0x0) {
      pQVar5 = pQVar2;
    }
    if (pQVar5 + lVar10 <= first || first < pQVar5) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        replace_in_place(str,indices,blen,after);
        return;
      }
      goto LAB_0011be44;
    }
    QVarLengthArray<QChar,_256LL>::QVarLengthArray<const_QChar_*,_true>
              ((QVarLengthArray<QChar,_256LL> *)local_258,first,first + lVar9);
    after_00.m_size = local_50;
    after_00.m_data = local_48;
    replace_in_place(str,indices,blen,after_00);
    QVarLengthArray<QChar,_256LL>::~QVarLengthArray((QVarLengthArray<QChar,_256LL> *)local_258);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0011be44:
  __stack_chk_fail();
}

Assistant:

static void replace_helper(QString &str, QSpan<size_t> indices, qsizetype blen, QStringView after)
{
    const qsizetype oldSize = str.data_ptr().size;
    const qsizetype adjust = indices.size() * (after.size() - blen);
    const qsizetype newSize = oldSize + adjust;
    if (str.data_ptr().needsDetach() || needsReallocate(str, newSize)) {
        replace_with_copy(str, indices, blen, after);
        return;
    }

    if (QtPrivate::q_points_into_range(after.begin(), str))
        // Copy after if it lies inside our own d.b area (which we could
        // possibly invalidate via a realloc or modify by replacement)
        replace_in_place(str, indices, blen, QVarLengthArray(after.begin(), after.end()));
    else
        replace_in_place(str, indices, blen, after);
}